

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.h
# Opt level: O1

TypeDef __thiscall winmd::reader::cache::find_required(cache *this,string_view *type_string)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  row_base<winmd::reader::TypeDef> rVar5;
  string_view local_58;
  string local_48;
  string_view local_28;
  ulong uVar4;
  
  uVar1 = type_string->_M_len;
  if (uVar1 == 0) {
LAB_0016d98c:
    uVar3 = 0xffffffffffffffff;
  }
  else {
    uVar4 = uVar1;
    do {
      uVar3 = uVar4 - 1;
      if (uVar4 == 0) goto LAB_0016d98c;
      lVar2 = uVar4 - 1;
      uVar4 = uVar3;
    } while (type_string->_M_str[lVar2] != '.');
  }
  if (uVar3 == 0xffffffffffffffff) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Type \'","");
    impl::throw_invalid<std::basic_string_view<char,std::char_traits<char>>,char[35]>
              (&local_48,type_string,(char (*) [35])"\' is missing a namespace qualifier");
  }
  local_58._M_len = uVar3;
  if (uVar1 < uVar3) {
    local_58._M_len = uVar1;
  }
  local_58._M_str = type_string->_M_str;
  if (uVar1 <= uVar3) {
    std::__throw_out_of_range_fmt
              ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr");
  }
  local_28._M_len = uVar1 - (uVar3 + 1);
  if (uVar1 <= local_28._M_len) {
    local_28._M_len = uVar1;
  }
  local_28._M_str = local_58._M_str + uVar3 + 1;
  rVar5 = (row_base<winmd::reader::TypeDef>)find_required(this,&local_58,&local_28);
  return (TypeDef)rVar5;
}

Assistant:

TypeDef find_required(std::string_view const& type_string) const
        {
            auto pos = type_string.rfind('.');

            if (pos == std::string_view::npos)
            {
                impl::throw_invalid("Type '", type_string, "' is missing a namespace qualifier");
            }

            return find_required(type_string.substr(0, pos), type_string.substr(pos + 1, type_string.size()));
        }